

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

iterator __thiscall
llvm::SmallVectorImpl<char_const*>::insert<char_const**,void>
          (SmallVectorImpl<char_const*> *this,iterator I,char **From,char **To)

{
  long lVar1;
  char **ppcVar2;
  size_t sVar3;
  char **E;
  char **local_110;
  char **J;
  size_t NumOverwritten;
  char **OldEnd;
  move_iterator<const_char_**> local_f0;
  char **local_e8;
  char **OldEnd_1;
  size_t NumToInsert;
  size_t InsertElt;
  char **To_local;
  char **From_local;
  iterator I_local;
  SmallVectorImpl<const_char_*> *this_local;
  SmallVectorImpl<char_const*> *local_a8;
  SmallVectorImpl<char_const*> *local_a0;
  SmallVectorImpl<char_const*> *local_90;
  SmallVectorImpl<char_const*> *local_88;
  SmallVectorImpl<char_const*> *local_80;
  SmallVectorImpl<char_const*> *local_78;
  SmallVectorImpl<char_const*> *local_70;
  SmallVectorImpl<char_const*> *local_68;
  SmallVectorImpl<char_const*> *local_60;
  SmallVectorImpl<char_const*> *local_58;
  SmallVectorImpl<char_const*> *local_50;
  SmallVectorImpl<char_const*> *local_48;
  SmallVectorImpl<char_const*> *local_40;
  SmallVectorImpl<char_const*> *local_38;
  SmallVectorImpl<char_const*> *local_30;
  SmallVectorImpl<char_const*> *local_28;
  SmallVectorImpl<char_const*> *local_20;
  SmallVectorImpl<char_const*> *local_18;
  SmallVectorImpl<char_const*> *local_10;
  
  NumToInsert = (long)I - *(long *)this >> 3;
  lVar1 = *(long *)this;
  InsertElt = (size_t)To;
  To_local = From;
  From_local = I;
  I_local = (iterator)this;
  local_90 = this;
  local_18 = this;
  local_10 = this;
  sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
  ppcVar2 = From_local;
  if (I == (iterator)(lVar1 + sVar3 * 8)) {
    append<char_const**,void>(this,To_local,(char **)InsertElt);
    this_local = (SmallVectorImpl<const_char_*> *)(*(long *)this + NumToInsert * 8);
  }
  else {
    local_a0 = this;
    if (From_local < *(char ***)this) {
      __assert_fail("I >= this->begin() && \"Insertion iterator is out of bounds.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x259,
                    "iterator llvm::SmallVectorImpl<const char *>::insert(iterator, ItTy, ItTy) [T = const char *, ItTy = const char **]"
                   );
    }
    lVar1 = *(long *)this;
    local_28 = this;
    local_20 = this;
    sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
    if ((char **)(lVar1 + sVar3 * 8) < ppcVar2) {
      __assert_fail("I <= this->end() && \"Inserting past the end of the vector.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x25a,
                    "iterator llvm::SmallVectorImpl<const char *>::insert(iterator, ItTy, ItTy) [T = const char *, ItTy = const char **]"
                   );
    }
    OldEnd_1 = (char **)std::distance<char_const**>(To_local,(char **)InsertElt);
    sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
    SmallVectorImpl<const_char_*>::reserve
              ((SmallVectorImpl<const_char_*> *)this,sVar3 + (long)OldEnd_1);
    From_local = (char **)(*(long *)this + NumToInsert * 8);
    lVar1 = *(long *)this;
    local_a8 = this;
    local_38 = this;
    local_30 = this;
    sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
    if ((char **)((long)((lVar1 + sVar3 * 8) - (long)From_local) >> 3) < OldEnd_1) {
      lVar1 = *(long *)this;
      local_78 = this;
      local_70 = this;
      sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
      E = (char **)(lVar1 + sVar3 * 8);
      sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
      SmallVectorBase::set_size((SmallVectorBase *)this,sVar3 + (long)OldEnd_1);
      ppcVar2 = From_local;
      J = (char **)((long)E - (long)From_local >> 3);
      lVar1 = *(long *)this;
      local_88 = this;
      local_80 = this;
      sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
      SmallVectorTemplateBase<char_const*,true>::uninitialized_move<char_const**,char_const**>
                (ppcVar2,E,(char **)(lVar1 + sVar3 * 8 + (long)J * -8));
      local_110 = From_local;
      for (; J != (char **)0x0; J = (char **)((long)J + -1)) {
        *local_110 = *To_local;
        local_110 = local_110 + 1;
        To_local = To_local + 1;
      }
      SmallVectorTemplateBase<char_const*,true>::uninitialized_copy<char_const*,char_const*>
                (To_local,(char **)InsertElt,E,(type *)0x0);
      this_local = (SmallVectorImpl<const_char_*> *)From_local;
    }
    else {
      lVar1 = *(long *)this;
      local_48 = this;
      local_40 = this;
      sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
      local_e8 = (char **)(lVar1 + sVar3 * 8);
      lVar1 = *(long *)this;
      local_58 = this;
      local_50 = this;
      sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
      std::move_iterator<const_char_**>::move_iterator
                (&local_f0,(iterator_type)(lVar1 + sVar3 * 8 + (long)OldEnd_1 * -8));
      lVar1 = *(long *)this;
      local_68 = this;
      local_60 = this;
      sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
      std::move_iterator<const_char_**>::move_iterator
                ((move_iterator<const_char_**> *)&OldEnd,(iterator_type)(lVar1 + sVar3 * 8));
      append<std::move_iterator<char_const**>,void>
                (this,local_f0,(move_iterator<const_char_**>)OldEnd);
      std::move_backward<char_const**,char_const**>(From_local,local_e8 + -(long)OldEnd_1,local_e8);
      std::copy<char_const**,char_const**>(To_local,(char **)InsertElt,From_local);
      this_local = (SmallVectorImpl<const_char_*> *)From_local;
    }
  }
  return (iterator)this_local;
}

Assistant:

iterator insert(iterator I, ItTy From, ItTy To) {
    // Convert iterator to elt# to avoid invalidating iterator when we reserve()
    size_t InsertElt = I - this->begin();

    if (I == this->end()) {  // Important special case for empty vector.
      append(From, To);
      return this->begin()+InsertElt;
    }

    assert(I >= this->begin() && "Insertion iterator is out of bounds.");
    assert(I <= this->end() && "Inserting past the end of the vector.");

    size_t NumToInsert = std::distance(From, To);

    // Ensure there is enough space.
    reserve(this->size() + NumToInsert);

    // Uninvalidate the iterator.
    I = this->begin()+InsertElt;

    // If there are more elements between the insertion point and the end of the
    // range than there are being inserted, we can use a simple approach to
    // insertion.  Since we already reserved space, we know that this won't
    // reallocate the vector.
    if (size_t(this->end()-I) >= NumToInsert) {
      T *OldEnd = this->end();
      append(std::move_iterator<iterator>(this->end() - NumToInsert),
             std::move_iterator<iterator>(this->end()));

      // Copy the existing elements that get replaced.
      std::move_backward(I, OldEnd-NumToInsert, OldEnd);

      std::copy(From, To, I);
      return I;
    }

    // Otherwise, we're inserting more elements than exist already, and we're
    // not inserting at the end.

    // Move over the elements that we're about to overwrite.
    T *OldEnd = this->end();
    this->set_size(this->size() + NumToInsert);
    size_t NumOverwritten = OldEnd-I;
    this->uninitialized_move(I, OldEnd, this->end()-NumOverwritten);

    // Replace the overwritten part.
    for (T *J = I; NumOverwritten > 0; --NumOverwritten) {
      *J = *From;
      ++J; ++From;
    }

    // Insert the non-overwritten middle part.
    this->uninitialized_copy(From, To, OldEnd);
    return I;
  }